

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void __thiscall
Catch::XmlReporter::benchmarkEnded
          (XmlReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
          *benchmarkStats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XmlWriter *pXVar2;
  XmlWriter *this_00;
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef name_04;
  StringRef name_05;
  StringRef name_06;
  StringRef name_07;
  StringRef name_08;
  StringRef name_09;
  StringRef name_10;
  StringRef name_11;
  string local_50;
  rep local_30;
  rep local_28;
  rep local_20;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mean","");
  this_00 = &this->m_xml;
  XmlWriter::startElement(this_00,&local_50,Newline|Indent);
  local_20 = (benchmarkStats->mean).point.__r;
  name.m_size = 5;
  name.m_start = "value";
  pXVar2 = XmlWriter::writeAttribute<double,void>(this_00,name,&local_20);
  local_28 = (benchmarkStats->mean).lower_bound.__r;
  name_00.m_size = 10;
  name_00.m_start = "lowerBound";
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,name_00,&local_28);
  local_30 = (benchmarkStats->mean).upper_bound.__r;
  name_01.m_size = 10;
  name_01.m_start = "upperBound";
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,name_01,&local_30);
  name_02.m_size = 2;
  name_02.m_start = "ci";
  XmlWriter::writeAttribute<double,void>(pXVar2,name_02,&(benchmarkStats->mean).confidence_interval)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  XmlWriter::endElement(this_00,Newline|Indent);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"standardDeviation","");
  XmlWriter::startElement(this_00,&local_50,Newline|Indent);
  local_20 = (benchmarkStats->standardDeviation).point.__r;
  name_03.m_size = 5;
  name_03.m_start = "value";
  pXVar2 = XmlWriter::writeAttribute<double,void>(this_00,name_03,&local_20);
  local_28 = (benchmarkStats->standardDeviation).lower_bound.__r;
  name_04.m_size = 10;
  name_04.m_start = "lowerBound";
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,name_04,&local_28);
  local_30 = (benchmarkStats->standardDeviation).upper_bound.__r;
  name_05.m_size = 10;
  name_05.m_start = "upperBound";
  pXVar2 = XmlWriter::writeAttribute<double,void>(pXVar2,name_05,&local_30);
  name_06.m_size = 2;
  name_06.m_start = "ci";
  XmlWriter::writeAttribute<double,void>
            (pXVar2,name_06,&(benchmarkStats->standardDeviation).confidence_interval);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  XmlWriter::endElement(this_00,Newline|Indent);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"outliers","");
  XmlWriter::startElement(this_00,&local_50,Newline|Indent);
  name_07.m_size = 8;
  name_07.m_start = "variance";
  pXVar2 = XmlWriter::writeAttribute<double,void>(this_00,name_07,&benchmarkStats->outlierVariance);
  name_08.m_size = 7;
  name_08.m_start = "lowMild";
  pXVar2 = XmlWriter::writeAttribute<int,void>(pXVar2,name_08,&(benchmarkStats->outliers).low_mild);
  name_09.m_size = 9;
  name_09.m_start = "lowSevere";
  pXVar2 = XmlWriter::writeAttribute<int,void>
                     (pXVar2,name_09,&(benchmarkStats->outliers).low_severe);
  name_10.m_size = 8;
  name_10.m_start = "highMild";
  pXVar2 = XmlWriter::writeAttribute<int,void>(pXVar2,name_10,&(benchmarkStats->outliers).high_mild)
  ;
  name_11.m_size = 10;
  name_11.m_start = "highSevere";
  XmlWriter::writeAttribute<int,void>(pXVar2,name_11,&(benchmarkStats->outliers).high_severe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  XmlWriter::endElement(this_00,Newline|Indent);
  XmlWriter::endElement(this_00,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::benchmarkEnded(BenchmarkStats<> const& benchmarkStats) {
        m_xml.startElement("mean")
            .writeAttribute("value"_sr, benchmarkStats.mean.point.count())
            .writeAttribute("lowerBound"_sr, benchmarkStats.mean.lower_bound.count())
            .writeAttribute("upperBound"_sr, benchmarkStats.mean.upper_bound.count())
            .writeAttribute("ci"_sr, benchmarkStats.mean.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("standardDeviation")
            .writeAttribute("value"_sr, benchmarkStats.standardDeviation.point.count())
            .writeAttribute("lowerBound"_sr, benchmarkStats.standardDeviation.lower_bound.count())
            .writeAttribute("upperBound"_sr, benchmarkStats.standardDeviation.upper_bound.count())
            .writeAttribute("ci"_sr, benchmarkStats.standardDeviation.confidence_interval);
        m_xml.endElement();
        m_xml.startElement("outliers")
            .writeAttribute("variance"_sr, benchmarkStats.outlierVariance)
            .writeAttribute("lowMild"_sr, benchmarkStats.outliers.low_mild)
            .writeAttribute("lowSevere"_sr, benchmarkStats.outliers.low_severe)
            .writeAttribute("highMild"_sr, benchmarkStats.outliers.high_mild)
            .writeAttribute("highSevere"_sr, benchmarkStats.outliers.high_severe);
        m_xml.endElement();
        m_xml.endElement();
    }